

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitGlobalSet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,GlobalSet *curr)

{
  char *pcVar1;
  Name name_00;
  bool bVar2;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  Literals *this_01;
  undefined1 local_80 [8];
  Flow flow;
  Name name;
  GlobalSet *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = *(char **)(curr + 0x10);
  pcVar1 = *(char **)(curr + 0x18);
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_80,this_00,*(Expression **)(curr + 0x20));
  bVar2 = Flow::breaking((Flow *)local_80);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_80);
  }
  else {
    name_00.super_IString.str._M_str = pcVar1;
    name_00.super_IString.str._M_len = (size_t)flow.breakTo.super_IString.str._M_str;
    this_01 = getGlobal(this,name_00);
    Literals::operator=(this_01,(Literals *)local_80);
    Flow::Flow(__return_storage_ptr__);
  }
  Flow::~Flow((Flow *)local_80);
  return __return_storage_ptr__;
}

Assistant:

Flow visitGlobalSet(GlobalSet* curr) {
    NOTE_ENTER("GlobalSet");
    auto name = curr->name;
    Flow flow = self()->visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(name);
    NOTE_EVAL1(flow.getSingleValue());

    getGlobal(name) = flow.values;
    return Flow();
  }